

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  pointer pOVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  pointer pAVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  bool *pbVar11;
  char *pcVar12;
  pointer pOVar13;
  int iVar14;
  undefined8 unaff_R12;
  ulong uVar15;
  pointer pOVar16;
  long lVar17;
  long lVar18;
  size_t arg_index;
  int local_6c;
  size_t local_68;
  ulong local_60;
  char **local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  pointer local_38;
  
  local_68 = 0;
  local_58 = argv;
  if (1 < argc) {
    iVar5 = 1;
    uVar15 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    do {
      pcVar7 = local_58[iVar5];
      if ((((uVar15 & 1) == 0) || (*pcVar7 != '-')) || (pcVar7[1] == '\0')) {
        HandleArgument(this,&local_68,pcVar7);
      }
      else {
        local_40 = pcVar7;
        if (pcVar7[1] == '-') {
          iVar9 = 0;
          if (pcVar7[2] == '\0') {
            uVar15 = 0;
          }
          else {
            pOVar13 = (this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar17 = (long)(this->options_).
                           super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar13;
            if (lVar17 == 0) {
              lVar17 = -1;
              lVar18 = 0;
              local_60 = uVar15;
            }
            else {
              local_50 = pcVar7 + 2;
              lVar17 = (lVar17 >> 4) * -0x71c71c71c71c71c7;
              pbVar11 = &pOVar13->has_argument;
              iVar14 = 0;
              local_6c = -1;
              lVar18 = 0;
              iVar9 = 0;
              local_60 = uVar15;
              local_38 = pOVar13;
              do {
                if (*(size_type *)(pbVar11 + -0x38) != 0) {
                  iVar4 = Match(local_50,(string *)(pbVar11 + -0x40),*pbVar11);
                  if (iVar14 < iVar4) {
                    iVar9 = 1;
                    local_6c = (int)lVar18;
                    iVar14 = iVar4;
                  }
                  else {
                    iVar9 = iVar9 + (uint)(0 < iVar14 && iVar4 == iVar14);
                  }
                }
                lVar18 = lVar18 + 1;
                pbVar11 = pbVar11 + 0x90;
              } while (lVar17 + (ulong)(lVar17 == 0) != lVar18);
              lVar17 = (long)local_6c;
              lVar18 = (long)iVar14;
              pOVar13 = local_38;
            }
            uVar15 = local_60;
            pcVar7 = local_40;
            if (iVar9 < 2) {
              if (iVar9 != 0) {
                iVar9 = iVar5;
                if (pOVar13[lVar17].has_argument == true) {
                  if ((local_40[lVar18 + 1] == '\0') || (local_40[lVar18 + 2] != '=')) {
                    iVar9 = iVar5 + 1;
                    if ((iVar9 == argc) || (pcVar7 = local_58[iVar9], *pcVar7 == '-')) {
                      pcVar12 = "option \'--%s\' requires argument";
                      pcVar7 = pOVar13[lVar17].long_name._M_dataplus._M_p;
                      goto LAB_0013894e;
                    }
                  }
                  else {
                    pcVar7 = local_40 + lVar18 + 3;
                  }
                }
                else {
                  pcVar7 = (char *)0x0;
                }
                iVar5 = iVar9;
                local_48 = pcVar7;
                if (pOVar13[lVar17].callback.super__Function_base._M_manager == (_Manager_type)0x0)
                {
LAB_001389fc:
                  std::__throw_bad_function_call();
                }
                (*pOVar13[lVar17].callback._M_invoker)
                          ((_Any_data *)&pOVar13[lVar17].callback,&local_48);
                goto LAB_00138749;
              }
              pcVar12 = "unknown option \'%s\'";
            }
            else {
              pcVar12 = "ambiguous option \'%s\'";
            }
LAB_0013894e:
            Errorf(this,pcVar12,pcVar7);
          }
        }
        else if (pcVar7[1] != '\0') {
          pcVar7 = pcVar7 + 1;
          pcVar12 = (char *)0x1;
          local_60 = uVar15;
          do {
            pOVar13 = (this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pOVar1 = (this->options_).
                     super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_50 = pcVar12;
            if (pOVar13 == pOVar1) {
              bVar8 = false;
            }
            else {
              bVar8 = false;
              do {
                pOVar16 = pOVar13 + 1;
                if ((pOVar13->short_name == '\0') || (*pcVar7 != pOVar13->short_name)) {
                  bVar2 = false;
                }
                else if (pOVar13->has_argument == true) {
                  if (pcVar7[1] == '\0') {
                    iVar9 = iVar5 + 1;
                    if ((iVar9 != argc) && (pcVar12 = local_58[iVar9], *pcVar12 != '-'))
                    goto LAB_001387e7;
                    Errorf(this,"option \'-%c\' requires argument");
                    bVar2 = true;
                  }
                  else {
                    Errorf(this,"option \'-%c\' requires argument");
                    bVar2 = true;
                  }
                }
                else {
                  pcVar12 = (char *)0x0;
                  iVar9 = iVar5;
LAB_001387e7:
                  local_48 = pcVar12;
                  if ((pOVar13->callback).super__Function_base._M_manager == (_Manager_type)0x0)
                  goto LAB_001389fc;
                  (*(pOVar13->callback)._M_invoker)((_Any_data *)&pOVar13->callback,&local_48);
                  bVar2 = true;
                  bVar8 = true;
                  iVar5 = iVar9;
                }
              } while ((!bVar2) && (pOVar13 = pOVar16, pOVar16 != pOVar1));
            }
            pcVar3 = local_40;
            pcVar12 = local_50;
            if (!bVar8) {
              Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)*pcVar7);
            }
            pcVar7 = pcVar3 + (long)pcVar12 + 1;
            pcVar12 = pcVar12 + 1;
            uVar15 = local_60;
          } while (*pcVar7 != '\0');
        }
      }
LAB_00138749:
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  pAVar6 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->arguments_).
        super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
        ._M_impl.super__Vector_impl_data._M_start != pAVar6) && (pAVar6[-1].handled_count == 0)) &&
     (pAVar6 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_68 <
     (ulong)(((long)(this->arguments_).
                    super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 4) *
            -0x3333333333333333))) {
    lVar17 = local_68 * 0x50 + 0x20;
    sVar10 = local_68;
    do {
      if (*(int *)((long)&(pAVar6->name)._M_dataplus._M_p + lVar17) != 2) {
        Errorf(this,"expected %s argument.",*(undefined8 *)((long)pAVar6 + lVar17 + -0x20));
      }
      sVar10 = sVar10 + 1;
      pAVar6 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x50;
    } while (sVar10 < (ulong)(((long)(this->arguments_).
                                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 4)
                             * -0x3333333333333333));
  }
  return;
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;
  bool processing_options = true;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (!processing_options || arg[0] != '-') {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
      continue;
    }

    if (arg[1] == '-') {
      if (arg[2] == '\0') {
        // -- on its own means stop processing args, everything should
        // be treated as positional.
        processing_options = false;
        continue;
      }
      // Long option.
      int best_index = -1;
      int best_length = 0;
      int best_count = 0;
      for (size_t j = 0; j < options_.size(); ++j) {
        const Option& option = options_[j];
        if (!option.long_name.empty()) {
          int match_length =
              Match(&arg[2], option.long_name, option.has_argument);
          if (match_length > best_length) {
            best_index = j;
            best_length = match_length;
            best_count = 1;
          } else if (match_length == best_length && best_length > 0) {
            best_count++;
          }
        }
      }

      if (best_count > 1) {
        Errorf("ambiguous option '%s'", arg);
        continue;
      } else if (best_count == 0) {
        Errorf("unknown option '%s'", arg);
        continue;
      }

      const Option& best_option = options_[best_index];
      const char* option_argument = nullptr;
      if (best_option.has_argument) {
        if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
            arg[best_length + 2] == '=') {  // +2 to skip "--".
          option_argument = &arg[best_length + 3];
        } else {
          if (i + 1 == argc || argv[i + 1][0] == '-') {
            Errorf("option '--%s' requires argument",
                   best_option.long_name.c_str());
            continue;
          }
          ++i;
          option_argument = argv[i];
        }
      }
      best_option.callback(option_argument);
    } else {
      // Short option.
      if (arg[1] == '\0') {
        // Just "-".
        HandleArgument(&arg_index, arg);
        continue;
      }

      // Allow short names to be combined, e.g. "-d -v" => "-dv".
      for (int k = 1; arg[k]; ++k) {
        bool matched = false;
        for (const Option& option : options_) {
          if (option.short_name && arg[k] == option.short_name) {
            const char* option_argument = nullptr;
            if (option.has_argument) {
              // A short option with a required argument cannot be followed
              // by other short options_.
              if (arg[k + 1] != '\0') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }

              if (i + 1 == argc || argv[i + 1][0] == '-') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }
              ++i;
              option_argument = argv[i];
            }
            option.callback(option_argument);
            matched = true;
            break;
          }
        }

        if (!matched) {
          Errorf("unknown option '-%c'", arg[k]);
          continue;
        }
      }
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      if (arguments_[i].count != ArgumentCount::ZeroOrMore) {
        Errorf("expected %s argument.", arguments_[i].name.c_str());
      }
    }
  }
}